

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

Vec4f __thiscall embree::XMLLoader::load<embree::Vec4<float>>(XMLLoader *this,Ref<embree::XML> *xml)

{
  Token *this_00;
  runtime_error *this_01;
  long *plVar1;
  long *plVar2;
  long *in_RDX;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 extraout_XMM0_Db;
  Vec4f VVar6;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  string local_40;
  
  this_00 = *(Token **)(*in_RDX + 0x98);
  if (*(long *)(*in_RDX + 0xa0) - (long)this_00 == 0x120) {
    fVar3 = Token::Float(this_00,true);
    fVar4 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x48),true);
    fVar5 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x90),true);
    VVar6.field_0._0_4_ = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0xd8),true);
    *(float *)&(this->path).filename._M_dataplus._M_p = fVar3;
    *(float *)((long)&(this->path).filename._M_dataplus._M_p + 4) = fVar4;
    *(float *)&(this->path).filename._M_string_length = fVar5;
    *(float *)((long)&(this->path).filename._M_string_length + 4) = VVar6.field_0._0_4_;
    VVar6.field_0.field_0.y = (float)extraout_XMM0_Db;
    VVar6.field_0.field_0.z = fVar5;
    VVar6.field_0.field_0.w = 0.0;
    return (Vec4f)VVar6.field_0;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(&local_40,(ParseLocation *)(*in_RDX + 0x10));
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_60 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_60 == plVar2) {
    local_50 = *plVar2;
    lStack_48 = plVar1[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar2;
  }
  local_58 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::runtime_error::runtime_error(this_01,(string *)&local_60);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Vec4f XMLLoader::load<Vec4f>(const Ref<XML>& xml) {
    if (xml->body.size() != 4) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong float4 body");
    return Vec4f(xml->body[0].Float(),xml->body[1].Float(),xml->body[2].Float(),xml->body[3].Float());
  }